

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O3

void __thiscall asl::Random::seed(Random *this,ULong s)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  long lVar9;
  long lVar10;
  
  uVar1 = s ^ 0x7a12345fb678ce93;
  auVar8._8_4_ = (int)uVar1;
  auVar8._0_8_ = uVar1;
  auVar8._12_4_ = (int)(uVar1 >> 0x20);
  lVar9 = 0;
  lVar10 = 1;
  lVar2 = 0;
  do {
    lVar9 = lVar9 + 2;
    lVar10 = lVar10 + 2;
    this->_state[lVar2] = uVar1 << lVar9 ^ uVar1;
    (this->_state + lVar2)[1] = auVar8._8_8_ << lVar10 ^ auVar8._8_8_;
    lVar2 = lVar2 + 2;
  } while (lVar2 != 4);
  uVar1 = this->_state[0];
  uVar5 = this->_state[1];
  uVar3 = this->_state[2];
  uVar4 = this->_state[3];
  iVar6 = 6;
  do {
    uVar7 = uVar5 << 0x11;
    uVar3 = uVar3 ^ uVar1;
    uVar4 = uVar4 ^ uVar5;
    uVar5 = uVar5 ^ uVar3;
    uVar1 = uVar1 ^ uVar4;
    uVar3 = uVar3 ^ uVar7;
    uVar4 = uVar4 << 0x2d | uVar4 >> 0x13;
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  this->_state[1] = uVar5;
  this->_state[0] = uVar1;
  this->_state[2] = uVar3;
  this->_state[3] = uVar4;
  return;
}

Assistant:

void Random::seed(ULong s)
{
	s ^= 0x7a12345fb678ce93ull;
	for (int i = 0; i < _size; i++)
		_state[i] = s ^ (s << (i + 2));

	for (int i = 0; i < 6; i++)
		get();
}